

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

DBErrors __thiscall wallet::WalletBatch::LoadWallet(WalletBatch *this,CWallet *pwallet)

{
  long lVar1;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_00;
  pointer puVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  DBErrors DVar7;
  LegacyDataSPKM *this_00;
  _Base_ptr p_Var8;
  LoadResult LVar9;
  LoadResult LVar10;
  LoadResult LVar11;
  LegacyScriptPubKeyMan *this_01;
  LoadResult LVar12;
  LoadResult LVar13;
  LoadResult LVar14;
  mapped_type *wtx;
  DBErrors DVar15;
  long lVar16;
  string *this_02;
  int parameters_1;
  long *plVar17;
  CWallet *pCVar18;
  DBErrors DVar19;
  uint256 *hash;
  pointer __k;
  long in_FS_OFFSET;
  undefined7 in_stack_fffffffffffffd38;
  CWallet *pCVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  int parameters_01;
  WalletBatch *this_03;
  int last_client;
  vector<uint256,_std::allocator<uint256>_> upgraded_txs;
  bool any_unordered;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  _Any_data local_208;
  code *local_1f8;
  code *local_1f0;
  _Any_data local_1e8;
  code *local_1d8;
  code *local_1d0;
  _Any_data local_1c8;
  code *local_1b8;
  code *local_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  long *local_120;
  DataStream prefix;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  string local_e8 [32];
  int num_ckeys;
  int nMinVersion;
  undefined4 uStack_a4;
  undefined1 auStack_a0 [24];
  _Base_ptr local_88;
  size_t local_80;
  set<std::pair<OutputType,_bool>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
  seen_spks;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  any_unordered = false;
  upgraded_txs.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  upgraded_txs.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  upgraded_txs.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock6,&pwallet->cs_wallet,"pwallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp"
             ,0x48e,false);
  last_client = 0x46c6c;
  bVar4 = DatabaseBatch::Read<std::__cxx11::string,int>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     DBKeys::VERSION_abi_cxx11_,&last_client);
  iVar6 = CWallet::GetVersion(pwallet);
  CWallet::WalletLogPrintf<int,int>
            (pwallet,"Wallet file version = %d, last client version = %d\n",iVar6,last_client);
  _nMinVersion = (ulong)(uint)uStack_a4 << 0x20;
  bVar5 = DatabaseBatch::Read<std::__cxx11::string,int>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     DBKeys::MINVERSION_abi_cxx11_,&nMinVersion);
  if (bVar5) {
    if (nMinVersion < 0x297ad) {
      pwallet->nWalletVersion = nMinVersion;
      goto LAB_00199bf9;
    }
  }
  else {
LAB_00199bf9:
    bVar5 = DatabaseBatch::Read<std::__cxx11::string,unsigned_long>
                      ((this->m_batch)._M_t.
                       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                       .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       DBKeys::FLAGS_abi_cxx11_,(unsigned_long *)&nMinVersion);
    if ((!bVar5) || (bVar5 = CWallet::LoadWalletFlags(pwallet,_nMinVersion), bVar5)) {
      iVar6 = last_client;
      _Var2._M_head_impl =
           (this->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      bVar5 = CWallet::IsWalletFlagSet(pwallet,0x400000000);
      if (bVar5) {
        plVar17 = (long *)(DBKeys::LEGACY_TYPES_abi_cxx11_ + 0x10);
        __str = &pwallet->m_name;
        pCVar18 = pwallet;
        do {
          plVar17 = (long *)*plVar17;
          if (plVar17 == (long *)0x0) {
            DVar19 = LOAD_OK;
            goto LAB_0019a29e;
          }
          auStack_a0._8_8_ = (_Base_ptr)0x0;
          auStack_a0._16_8_ = (_Base_ptr)0x0;
          _nMinVersion = (pointer)0x0;
          auStack_a0._0_8_ = (pointer)0x0;
          seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
          seen_spks._M_t._M_impl._0_8_ = 0;
          seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          prefix.m_read_pos = 0;
          prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          Serialize<DataStream,char>
                    (&prefix,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (plVar17 + 1));
          (*(_Var2._M_head_impl)->_vptr_DatabaseBatch[10])
                    (&local_120,_Var2._M_head_impl,
                     prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                     ._M_impl.super__Vector_impl_data._M_start + prefix.m_read_pos,
                     (long)prefix.vch.
                           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(prefix.vch.
                            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start + prefix.m_read_pos));
          if (local_120 == (long *)0x0) {
            this_02 = (string *)&num_ckeys;
            std::__cxx11::string::string
                      (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (plVar17 + 1));
            parameters_00._M_dataplus._M_p._7_1_ = bVar4;
            parameters_00._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffd38;
            parameters_00._M_string_length = (size_type)pCVar18;
            parameters_00.field_2._M_allocated_capacity._0_4_ = (int)__str;
            parameters_00.field_2._M_allocated_capacity._4_4_ = (int)((ulong)__str >> 0x20);
            parameters_00.field_2._8_8_ = this;
            CWallet::WalletLogPrintf<std::__cxx11::string>
                      (pCVar18,"Error getting database cursor for \'%s\' records\n",parameters_00);
            pwallet = (CWallet *)0x9;
LAB_00199d8a:
            std::__cxx11::string::~string(this_02);
            bVar5 = false;
          }
          else {
            iVar6 = (**(code **)(*local_120 + 0x10))
                              (local_120,
                               (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                               &nMinVersion,&seen_spks);
            bVar5 = true;
            if (iVar6 != 2) {
              std::__cxx11::string::string(local_e8,__str);
              this_02 = local_e8;
              parameters._M_dataplus._M_p._7_1_ = bVar4;
              parameters._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffd38;
              parameters._M_string_length = (size_type)pCVar18;
              parameters.field_2._M_allocated_capacity._0_4_ = (int)__str;
              parameters.field_2._M_allocated_capacity._4_4_ = (int)((ulong)__str >> 0x20);
              parameters.field_2._8_8_ = this;
              CWallet::WalletLogPrintf<std::__cxx11::string>
                        (pCVar18,
                         "Error: Unexpected legacy entry found in descriptor wallet %s. The wallet might have been tampered with or created with malicious intent.\n"
                         ,parameters);
              pwallet = (CWallet *)0x8;
              goto LAB_00199d8a;
            }
          }
          DVar7 = (DBErrors)pwallet;
          if (local_120 != (long *)0x0) {
            (**(code **)(*local_120 + 8))();
          }
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&prefix);
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&seen_spks);
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&nMinVersion)
          ;
        } while (bVar5);
      }
      else {
        local_148._M_unused._M_object = (void *)0x0;
        local_148._8_8_ = 0;
        local_130 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:572:9)>
                    ::_M_invoke;
        local_138 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:572:9)>
                    ::_M_manager;
        pCVar18 = pwallet;
        LVar12 = LoadRecords(pwallet,_Var2._M_head_impl,(string *)DBKeys::HDCHAIN_abi_cxx11_,
                             (LoadFunc *)&local_148);
        std::_Function_base::~_Function_base((_Function_base *)&local_148);
        local_168._M_unused._M_object = (void *)0x0;
        local_168._8_8_ = 0;
        local_150 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:579:9)>
                    ::_M_invoke;
        local_158 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:579:9)>
                    ::_M_manager;
        LVar13 = LoadRecords(pwallet,_Var2._M_head_impl,(string *)DBKeys::KEY_abi_cxx11_,
                             (LoadFunc *)&local_168);
        DVar7 = LVar13.m_result;
        parameters_01 = LVar13.m_records;
        std::_Function_base::~_Function_base((_Function_base *)&local_168);
        local_188._M_unused._M_object = (void *)0x0;
        local_188._8_8_ = 0;
        local_170 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:586:9)>
                    ::_M_invoke;
        local_178 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:586:9)>
                    ::_M_manager;
        LVar13 = LoadRecords(pwallet,_Var2._M_head_impl,(string *)DBKeys::CRYPTED_KEY_abi_cxx11_,
                             (LoadFunc *)&local_188);
        std::_Function_base::~_Function_base((_Function_base *)&local_188);
        local_1a8._M_unused._M_object = (void *)0x0;
        local_1a8._8_8_ = 0;
        local_190 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:593:9)>
                    ::_M_invoke;
        local_198 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:593:9)>
                    ::_M_manager;
        LVar14 = LoadRecords(pwallet,_Var2._M_head_impl,(string *)DBKeys::CSCRIPT_abi_cxx11_,
                             (LoadFunc *)&local_1a8);
        DVar19 = LVar12.m_result;
        if ((int)LVar12.m_result <= (int)DVar7) {
          DVar19 = DVar7;
        }
        if ((int)DVar19 <= (int)LVar13.m_result) {
          DVar19 = LVar13.m_result;
        }
        std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
        if ((int)DVar19 <= (int)LVar14.m_result) {
          DVar19 = LVar14.m_result;
        }
        DVar7 = LOAD_OK;
        if (0 < (int)DVar19) {
          DVar7 = DVar19;
        }
        parameters_1 = LVar13.m_records;
        if ((0 < parameters_1) &&
           (((iVar6 == 50000 || (iVar6 == 40000)) && (DVar7 = NEED_REWRITE, 2 < (int)DVar19)))) {
          DVar7 = DVar19;
        }
        auStack_a0._0_8_ = (ulong)(uint)auStack_a0._4_4_ << 0x20;
        auStack_a0._8_8_ = (_Base_ptr)0x0;
        local_80 = 0;
        local_1c8._8_8_ = 0;
        local_1c8._M_unused._M_object = &nMinVersion;
        local_1b0 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:616:9)>
                    ::_M_invoke;
        local_1b8 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:616:9)>
                    ::_M_manager;
        pCVar20 = pCVar18;
        auStack_a0._16_8_ = (_Base_ptr)auStack_a0;
        local_88 = (_Base_ptr)auStack_a0;
        LVar12 = LoadRecords(pCVar18,_Var2._M_head_impl,(string *)DBKeys::KEYMETA_abi_cxx11_,
                             (LoadFunc *)&local_1c8);
        std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
        if ((int)DVar7 <= (int)LVar12.m_result) {
          DVar7 = LVar12.m_result;
        }
        if (local_80 != 0) {
          this_00 = CWallet::GetLegacyDataSPKM(pCVar18);
          if (this_00 == (LegacyDataSPKM *)0x0) {
            CWallet::WalletLogPrintf<>
                      (pCVar18,"Inactive HD Chains found but no Legacy ScriptPubKeyMan\n");
            DVar7 = CORRUPT;
          }
          else {
            pCVar18 = pCVar20;
            for (p_Var8 = (_Base_ptr)auStack_a0._16_8_; pCVar20 = pCVar18,
                p_Var8 != (_Base_ptr)auStack_a0;
                p_Var8 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8)) {
              bVar5 = operator!=((base_blob<160U> *)(p_Var8 + 1),
                                 (base_blob<160U> *)&(this_00->m_hd_chain).seed_id);
              if (bVar5) {
                LegacyDataSPKM::AddInactiveHDChain(this_00,(CHDChain *)&p_Var8[1]._M_right);
              }
            }
          }
        }
        local_1e8._M_unused._M_object = (void *)0x0;
        local_1e8._8_8_ = 0;
        local_1d0 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:703:9)>
                    ::_M_invoke;
        local_1d8 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:703:9)>
                    ::_M_manager;
        LVar13 = LoadRecords(pCVar18,_Var2._M_head_impl,(string *)DBKeys::WATCHS_abi_cxx11_,
                             (LoadFunc *)&local_1e8);
        std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
        local_208._M_unused._M_object = (void *)0x0;
        local_208._8_8_ = 0;
        local_1f0 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:717:9)>
                    ::_M_invoke;
        local_1f8 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:717:9)>
                    ::_M_manager;
        LVar14 = LoadRecords(pCVar18,_Var2._M_head_impl,(string *)DBKeys::WATCHMETA_abi_cxx11_,
                             (LoadFunc *)&local_208);
        std::_Function_base::~_Function_base((_Function_base *)&local_208);
        local_228._M_unused._M_object = (void *)0x0;
        local_228._8_8_ = 0;
        local_210 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:729:9)>
                    ::_M_invoke;
        local_218 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:729:9)>
                    ::_M_manager;
        LVar9 = LoadRecords(pCVar18,_Var2._M_head_impl,(string *)DBKeys::POOL_abi_cxx11_,
                            (LoadFunc *)&local_228);
        std::_Function_base::~_Function_base((_Function_base *)&local_228);
        local_248._M_unused._M_object = (void *)0x0;
        local_248._8_8_ = 0;
        local_230 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:746:9)>
                    ::_M_invoke;
        local_238 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:746:9)>
                    ::_M_manager;
        LVar10 = LoadRecords(pCVar18,_Var2._M_head_impl,(string *)DBKeys::DEFAULTKEY_abi_cxx11_,
                             (LoadFunc *)&local_248);
        std::_Function_base::~_Function_base((_Function_base *)&local_248);
        local_268._M_unused._M_object = (void *)0x0;
        local_268._8_8_ = 0;
        local_250 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:764:9)>
                    ::_M_invoke;
        local_258 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:764:9)>
                    ::_M_manager;
        LVar11 = LoadRecords(pCVar18,_Var2._M_head_impl,(string *)DBKeys::OLD_KEY_abi_cxx11_,
                             (LoadFunc *)&local_268);
        if ((int)DVar7 <= (int)LVar13.m_result) {
          DVar7 = LVar13.m_result;
        }
        if ((int)DVar7 <= (int)LVar14.m_result) {
          DVar7 = LVar14.m_result;
        }
        if ((int)DVar7 <= (int)LVar9.m_result) {
          DVar7 = LVar9.m_result;
        }
        if ((int)DVar7 <= (int)LVar10.m_result) {
          DVar7 = LVar10.m_result;
        }
        std::_Function_base::~_Function_base((_Function_base *)&local_268);
        if ((int)DVar7 <= (int)LVar11.m_result) {
          DVar7 = LVar11.m_result;
        }
        pCVar18 = pCVar20;
        if ((int)DVar7 < 5) {
          CWallet::WalletLogPrintf<int,int,int,int>
                    (pCVar20,
                     "Legacy Wallet Keys: %u plaintext, %u encrypted, %u w/ metadata, %u total.\n",
                     parameters_01,parameters_1,LVar12.m_records,parameters_1 + parameters_01);
          bVar5 = CWallet::IsLegacy(pCVar20);
          if (((bVar5) &&
              (parameters_1 + parameters_01 + LVar13.m_records !=
               LVar14.m_records + LVar12.m_records)) &&
             (this_01 = CWallet::GetLegacyScriptPubKeyMan(pCVar18),
             this_01 != (LegacyScriptPubKeyMan *)0x0)) {
            UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&seen_spks,
                       &(this_01->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,
                       "spk_man->cs_KeyStore",
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp"
                       ,0x30b,false);
            LegacyScriptPubKeyMan::UpdateTimeFirstKey(this_01,1);
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)&seen_spks);
          }
        }
        std::
        _Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
        ::~_Rb_tree((_Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
                     *)&nMinVersion);
      }
      DVar19 = LOAD_OK;
      if (0 < (int)DVar7) {
        DVar19 = DVar7;
      }
LAB_0019a29e:
      _Var2._M_head_impl =
           (this->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)prefix.vch.
                            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
      num_ckeys = 0;
      seen_spks._M_t._M_impl._0_4_ = last_client;
      _nMinVersion = (pointer)0x0;
      auStack_a0._0_8_ = (pointer)0x0;
      auStack_a0._8_8_ = (_Base_ptr)0x0;
      auStack_a0._16_8_ = (_Base_ptr)0x0;
      this_03 = this;
      _nMinVersion = operator_new(0x20);
      *(DatabaseBatch **)_nMinVersion = _Var2._M_head_impl;
      *(DataStream **)(_nMinVersion + 8) = &prefix;
      *(int **)(_nMinVersion + 0x10) = &num_ckeys;
      *(set<std::pair<OutputType,_bool>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
        **)(_nMinVersion + 0x18) = &seen_spks;
      auStack_a0._16_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:804:9)>
           ::_M_invoke;
      auStack_a0._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:804:9)>
           ::_M_manager;
      LVar12 = LoadRecords(pCVar18,_Var2._M_head_impl,(string *)DBKeys::WALLETDESCRIPTOR_abi_cxx11_,
                           (LoadFunc *)&nMinVersion);
      std::_Function_base::~_Function_base((_Function_base *)&nMinVersion);
      DVar7 = LVar12.m_result;
      if ((int)DVar7 < 5) {
        CWallet::WalletLogPrintf<int,int,int,int>
                  (pCVar18,
                   "Descriptors: %u, Descriptor Keys: %u plaintext, %u encrypted, %u total.\n",
                   LVar12.m_records,
                   (int)prefix.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_start,num_ckeys,
                   num_ckeys +
                   (int)prefix.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      if ((int)DVar19 <= (int)DVar7) {
        DVar19 = DVar7;
      }
      if (DVar19 == UNKNOWN_DESCRIPTOR) {
        DVar7 = UNKNOWN_DESCRIPTOR;
      }
      else {
        _Var2._M_head_impl =
             (this->m_batch)._M_t.
             super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
             .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
        _nMinVersion = (pointer)0x0;
        auStack_a0._0_8_ = (pointer)0x0;
        auStack_a0._16_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:974:9)>
             ::_M_invoke;
        auStack_a0._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:974:9)>
             ::_M_manager;
        pCVar20 = pCVar18;
        LVar12 = LoadRecords(pCVar18,_Var2._M_head_impl,(string *)DBKeys::NAME_abi_cxx11_,
                             (LoadFunc *)&nMinVersion);
        std::_Function_base::~_Function_base((_Function_base *)&nMinVersion);
        seen_spks._M_t._M_impl._0_8_ = 0;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:986:9)>
             ::_M_invoke;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:986:9)>
             ::_M_manager;
        LVar13 = LoadRecords(pCVar18,_Var2._M_head_impl,(string *)DBKeys::PURPOSE_abi_cxx11_,
                             (LoadFunc *)&seen_spks);
        std::_Function_base::~_Function_base((_Function_base *)&seen_spks);
        prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        prefix.m_read_pos =
             (size_type)
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1002:9)>
             ::_M_invoke;
        prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1002:9)>
                      ::_M_manager;
        LVar14 = LoadRecords(pCVar18,_Var2._M_head_impl,(string *)DBKeys::DESTDATA_abi_cxx11_,
                             (LoadFunc *)&prefix);
        DVar7 = LVar13.m_result;
        if ((int)LVar13.m_result < (int)LVar12.m_result) {
          DVar7 = LVar12.m_result;
        }
        std::_Function_base::~_Function_base((_Function_base *)&prefix);
        if ((int)DVar7 <= (int)LVar14.m_result) {
          DVar7 = LVar14.m_result;
        }
        DVar15 = LOAD_OK;
        if (0 < (int)DVar7) {
          DVar15 = DVar7;
        }
        if (DVar15 <= DVar19) {
          DVar15 = DVar19;
        }
        _Var2._M_head_impl =
             (this_03->m_batch)._M_t.
             super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
             .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
        _nMinVersion = &any_unordered;
        any_unordered = false;
        auStack_a0._0_8_ = &upgraded_txs;
        auStack_a0._16_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1036:9)>
             ::_M_invoke;
        auStack_a0._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1036:9)>
             ::_M_manager;
        pCVar18 = pCVar20;
        LVar12 = LoadRecords(pCVar20,_Var2._M_head_impl,(string *)DBKeys::TX_abi_cxx11_,
                             (LoadFunc *)&nMinVersion);
        std::_Function_base::~_Function_base((_Function_base *)&nMinVersion);
        seen_spks._M_t._M_impl._0_8_ = 0;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1089:9)>
             ::_M_invoke;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1089:9)>
             ::_M_manager;
        LVar13 = LoadRecords(pCVar20,_Var2._M_head_impl,(string *)DBKeys::LOCKED_UTXO_abi_cxx11_,
                             (LoadFunc *)&seen_spks);
        std::_Function_base::~_Function_base((_Function_base *)&seen_spks);
        prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        prefix.m_read_pos =
             (size_type)
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1102:9)>
             ::_M_invoke;
        prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1102:9)>
                      ::_M_manager;
        LVar14 = LoadRecords(pCVar18,_Var2._M_head_impl,(string *)DBKeys::ORDERPOSNEXT_abi_cxx11_,
                             (LoadFunc *)&prefix);
        DVar19 = LVar13.m_result;
        if ((int)LVar13.m_result < (int)LVar12.m_result) {
          DVar19 = LVar12.m_result;
        }
        std::_Function_base::~_Function_base((_Function_base *)&prefix);
        if ((int)DVar19 <= (int)LVar14.m_result) {
          DVar19 = LVar14.m_result;
        }
        DVar7 = LOAD_OK;
        if (0 < (int)DVar19) {
          DVar7 = DVar19;
        }
        if (DVar7 <= DVar15) {
          DVar7 = DVar15;
        }
        _Var2._M_head_impl =
             (this_03->m_batch)._M_t.
             super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
             .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &seen_spks._M_t._M_impl.super__Rb_tree_header._M_header;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             seen_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::__cxx11::string::string
                  ((string *)&nMinVersion,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_);
        std::__cxx11::string::string
                  ((string *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   DBKeys::ACTIVEINTERNALSPK_abi_cxx11_);
        DVar19 = LOAD_OK;
        for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x20) {
          prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)((long)&nMinVersion + lVar16);
          prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&seen_spks;
          prefix.m_read_pos =
               (size_type)
               std::
               _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1125:13)>
               ::_M_invoke;
          prefix.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1125:13)>
                        ::_M_manager;
          LVar12 = LoadRecords(pCVar18,_Var2._M_head_impl,
                               (string *)
                               prefix.vch.
                               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(LoadFunc *)&prefix);
          std::_Function_base::~_Function_base((_Function_base *)&prefix);
          DVar15 = LVar12.m_result;
          if ((int)LVar12.m_result < (int)DVar19) {
            DVar15 = DVar19;
          }
          DVar19 = DVar15;
        }
        lVar16 = 0x20;
        do {
          std::__cxx11::string::~string((string *)((long)&nMinVersion + lVar16));
          lVar16 = lVar16 + -0x20;
        } while (lVar16 != -0x20);
        std::
        _Rb_tree<std::pair<OutputType,_bool>,_std::pair<OutputType,_bool>,_std::_Identity<std::pair<OutputType,_bool>_>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
        ::~_Rb_tree(&seen_spks._M_t);
        _nMinVersion = (pointer)0x0;
        auStack_a0._0_8_ = (pointer)0x0;
        auStack_a0._16_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1151:9)>
             ::_M_invoke;
        auStack_a0._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1151:9)>
             ::_M_manager;
        LVar12 = LoadRecords(pCVar18,(this_03->m_batch)._M_t.
                                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>.
                                     _M_head_impl,(string *)DBKeys::MASTER_KEY_abi_cxx11_,
                             (LoadFunc *)&nMinVersion);
        if ((int)DVar7 < (int)DVar19) {
          DVar7 = DVar19;
        }
        std::_Function_base::~_Function_base((_Function_base *)&nMinVersion);
        puVar3 = upgraded_txs.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((int)DVar7 <= (int)LVar12.m_result) {
          DVar7 = LVar12.m_result;
        }
        if (DVar7 == LOAD_OK) {
          for (__k = upgraded_txs.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start; __k != puVar3; __k = __k + 1) {
            wtx = std::__detail::
                  _Map_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::at((_Map_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)&pCVar18->mapWallet,__k);
            WriteTx(this_03,wtx);
          }
          if ((bVar4 & last_client == 0x46c6c) == 0) {
            DatabaseBatch::Write<std::__cxx11::string,int>
                      ((this_03->m_batch)._M_t.
                       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                       .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       DBKeys::VERSION_abi_cxx11_,&CLIENT_VERSION,true);
          }
          DVar7 = LOAD_OK;
          if (any_unordered == true) {
            DVar7 = CWallet::ReorderTransactions(pCVar18);
          }
          CWallet::UpgradeKeyMetadata(pCVar18);
          CWallet::UpgradeDescriptorCache(pCVar18);
        }
      }
      goto LAB_0019a389;
    }
    CWallet::WalletLogPrintf<>
              (pwallet,"Error reading wallet database: Unknown non-tolerable wallet flags found\n");
  }
  DVar7 = TOO_NEW;
LAB_0019a389:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock6.super_unique_lock);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&upgraded_txs.super__Vector_base<uint256,_std::allocator<uint256>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return DVar7;
}

Assistant:

DBErrors WalletBatch::LoadWallet(CWallet* pwallet)
{
    DBErrors result = DBErrors::LOAD_OK;
    bool any_unordered = false;
    std::vector<uint256> upgraded_txs;

    LOCK(pwallet->cs_wallet);

    // Last client version to open this wallet
    int last_client = CLIENT_VERSION;
    bool has_last_client = m_batch->Read(DBKeys::VERSION, last_client);
    pwallet->WalletLogPrintf("Wallet file version = %d, last client version = %d\n", pwallet->GetVersion(), last_client);

    try {
        if ((result = LoadMinVersion(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

        // Load wallet flags, so they are known when processing other records.
        // The FLAGS key is absent during wallet creation.
        if ((result = LoadWalletFlags(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

#ifndef ENABLE_EXTERNAL_SIGNER
        if (pwallet->IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
            pwallet->WalletLogPrintf("Error: External signer wallet being loaded without external signer support compiled\n");
            return DBErrors::EXTERNAL_SIGNER_SUPPORT_REQUIRED;
        }
#endif

        // Load legacy wallet keys
        result = std::max(LoadLegacyWalletRecords(pwallet, *m_batch, last_client), result);

        // Load descriptors
        result = std::max(LoadDescriptorWalletRecords(pwallet, *m_batch, last_client), result);
        // Early return if there are unknown descriptors. Later loading of ACTIVEINTERNALSPK and ACTIVEEXTERNALEXPK
        // may reference the unknown descriptor's ID which can result in a misleading corruption error
        // when in reality the wallet is simply too new.
        if (result == DBErrors::UNKNOWN_DESCRIPTOR) return result;

        // Load address book
        result = std::max(LoadAddressBookRecords(pwallet, *m_batch), result);

        // Load tx records
        result = std::max(LoadTxRecords(pwallet, *m_batch, upgraded_txs, any_unordered), result);

        // Load SPKMs
        result = std::max(LoadActiveSPKMs(pwallet, *m_batch), result);

        // Load decryption keys
        result = std::max(LoadDecryptionKeys(pwallet, *m_batch), result);
    } catch (...) {
        // Exceptions that can be ignored or treated as non-critical are handled by the individual loading functions.
        // Any uncaught exceptions will be caught here and treated as critical.
        result = DBErrors::CORRUPT;
    }

    // Any wallet corruption at all: skip any rewriting or
    // upgrading, we don't want to make it worse.
    if (result != DBErrors::LOAD_OK)
        return result;

    for (const uint256& hash : upgraded_txs)
        WriteTx(pwallet->mapWallet.at(hash));

    if (!has_last_client || last_client != CLIENT_VERSION) // Update
        m_batch->Write(DBKeys::VERSION, CLIENT_VERSION);

    if (any_unordered)
        result = pwallet->ReorderTransactions();

    // Upgrade all of the wallet keymetadata to have the hd master key id
    // This operation is not atomic, but if it fails, updated entries are still backwards compatible with older software
    try {
        pwallet->UpgradeKeyMetadata();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    // Upgrade all of the descriptor caches to cache the last hardened xpub
    // This operation is not atomic, but if it fails, only new entries are added so it is backwards compatible
    try {
        pwallet->UpgradeDescriptorCache();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    return result;
}